

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  EditType EVar1;
  string *psVar2;
  _List_node_base *p_Var3;
  ostream *poVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  char edit;
  ulong uVar11;
  pointer pEVar12;
  long lVar13;
  _List_node_base *p_Var14;
  ulong uVar15;
  ulong uVar16;
  size_t i;
  size_t sVar17;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  Hunk hunk;
  stringstream ss;
  char local_269;
  ulong local_268;
  size_t local_260;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  local_258;
  Hunk local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  string *local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_260 = context;
  local_1c8 = __return_storage_ptr__;
  local_1c0 = right;
  CalculateOptimalEdits(&local_258,left,right);
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar8 = 0;
  uVar16 = 0;
  lVar10 = 0;
  local_1d0 = left;
  do {
    uVar6 = (long)local_258.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_258.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2;
    if (uVar6 <= uVar16) break;
    uVar11 = (uVar8 + uVar6) - uVar16;
    lVar13 = (uVar6 + lVar10) - uVar16;
    uVar7 = uVar8;
    lVar9 = lVar10;
    uVar15 = uVar16;
    do {
      uVar8 = uVar7;
      lVar10 = lVar9;
      uVar16 = uVar15;
      if (local_258.
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar15] != kMatch) break;
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 1;
      uVar15 = uVar15 + 1;
      uVar8 = uVar11;
      lVar10 = lVar13;
      uVar16 = uVar6;
    } while (uVar6 != uVar15);
    sVar17 = local_260;
    if (uVar8 < local_260) {
      sVar17 = uVar8;
    }
    local_240.left_start_ = (uVar8 - sVar17) + 1;
    local_240.right_start_ = (lVar10 - sVar17) + 1;
    local_240.common_ = 0;
    local_240.adds_ = 0;
    local_240.removes_ = 0;
    local_240.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_240.hunk_;
    local_240.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    local_240.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_240.hunk_adds_;
    local_240.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    local_240.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_240.hunk_removes_;
    local_240.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    local_240.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_240.hunk_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    local_240.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_240.hunk_adds_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    local_240.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_240.hunk_removes_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    if (sVar17 != 0) {
      lVar9 = uVar8 * 0x20 + sVar17 * -0x20;
      do {
        anon_unknown_1::Hunk::PushLine
                  (&local_240,' ',
                   *(char **)((long)&(((left->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar9));
        lVar9 = lVar9 + 0x20;
        sVar17 = sVar17 - 1;
      } while (sVar17 != 0);
      uVar6 = (long)local_258.
                    super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_258.
                    super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2;
    }
    if (uVar16 < uVar6) {
      lVar9 = uVar16 * 4;
      uVar6 = 0;
      do {
        lVar9 = (lVar9 << 0x1e) >> 0x1e;
        if (local_260 <= uVar6) {
          pEVar12 = local_258.
                    super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                    ._M_impl.super__Vector_impl_data._M_start + (int)uVar16;
          lVar13 = lVar9;
          while( true ) {
            if (pEVar12 ==
                local_258.
                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0014d930;
            if (*pEVar12 != kMatch) break;
            pEVar12 = pEVar12 + 1;
            lVar13 = lVar13 + 4;
          }
          if ((pEVar12 ==
               local_258.
               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               ._M_impl.super__Vector_impl_data._M_finish) || (local_260 <= (lVar13 >> 2) - uVar16))
          break;
        }
        EVar1 = local_258.
                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16];
        local_268 = uVar6 + 1;
        if (EVar1 != kMatch) {
          local_268 = 0;
        }
        if ((EVar1 < 4) && (EVar1 != kAdd)) {
          edit = '-';
          if (EVar1 == kMatch) {
            edit = ' ';
          }
          anon_unknown_1::Hunk::PushLine
                    (&local_240,edit,
                     (local_1d0->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p);
        }
        if ((EVar1 & ~kRemove) == kAdd) {
          p_Var14 = (_List_node_base *)
                    (local_1c0->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar10]._M_dataplus._M_p;
          local_240.adds_ = local_240.adds_ + 1;
          p_Var3 = (_List_node_base *)operator_new(0x20);
          *(undefined1 *)&p_Var3[1]._M_next = 0x2b;
          p_Var3[1]._M_prev = p_Var14;
          std::__detail::_List_node_base::_M_hook(p_Var3);
          local_240.hunk_adds_.
          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          ._M_impl._M_node._M_size =
               local_240.hunk_adds_.
               super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
               ._M_impl._M_node._M_size + 1;
        }
        uVar8 = uVar8 + (EVar1 != kAdd);
        lVar10 = lVar10 + (ulong)(EVar1 != kRemove);
        uVar16 = uVar16 + 1;
        lVar9 = lVar9 + 4;
        uVar6 = local_268;
      } while (uVar16 < (ulong)((long)local_258.
                                      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_258.
                                      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2));
    }
LAB_0014d930:
    local_268 = CONCAT71(local_268._1_7_,local_240.removes_ != 0 || local_240.adds_ != 0);
    if (local_240.removes_ != 0 || local_240.adds_ != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"@@ ",3);
      if (local_240.removes_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"-",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        if (local_240.adds_ != 0 && local_240.removes_ != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        }
      }
      if (local_240.adds_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"+",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," @@\n",4);
      anon_unknown_1::Hunk::FlushEdits(&local_240);
      p_Var14 = local_240.hunk_.
                super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      if (local_240.hunk_.
          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_240.hunk_) {
        do {
          local_269 = *(char *)&p_Var14[1]._M_next;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_269,1);
          p_Var3 = p_Var14[1]._M_prev;
          if (p_Var3 == (_List_node_base *)0x0) {
            std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          }
          else {
            sVar5 = strlen((char *)p_Var3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)p_Var3,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          p_Var14 = p_Var14->_M_next;
        } while (p_Var14 != (_List_node_base *)&local_240.hunk_);
      }
    }
    p_Var14 = local_240.hunk_removes_.
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    left = local_1d0;
    while (local_1d0 = left, p_Var14 != (_List_node_base *)&local_240.hunk_removes_) {
      p_Var3 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var14,0x20);
      p_Var14 = p_Var3;
      left = local_1d0;
    }
    p_Var14 = local_240.hunk_adds_.
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var14 != (_List_node_base *)&local_240.hunk_adds_) {
      p_Var3 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var14,0x20);
      p_Var14 = p_Var3;
    }
    p_Var14 = local_240.hunk_.
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (local_240.hunk_.
        super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_240.hunk_) {
      do {
        p_Var3 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                    *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var14,0x20);
        p_Var14 = p_Var3;
      } while (p_Var3 != (_List_node_base *)&local_240.hunk_);
    }
  } while ((char)local_268 != '\0');
  psVar2 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_258.
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return psVar2;
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        auto it = edits.begin() + static_cast<int>(edit_i);
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() ||
            static_cast<size_t>(it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}